

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_child_block
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  bool bVar1;
  reference pBVar2;
  BlockOrRecord *child_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  Vector<BlockOrRecord> *__range3_1;
  BlockOrRecord *child;
  const_iterator __end3;
  const_iterator __begin3;
  Vector<BlockOrRecord> *__range3;
  BlockOrRecord *entry_local;
  ModuleParseContext *this_local;
  
  if (entry->id == 0xb) {
    __end3 = std::
             vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>::
             begin(&entry->children);
    child = (BlockOrRecord *)
            std::
            vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>::
            end(&entry->children);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
                                       *)&child), bVar1) {
      pBVar2 = __gnu_cxx::
               __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
               ::operator*(&__end3);
      bVar1 = parse_constants_record(this,pBVar2);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
      ::operator++(&__end3);
    }
  }
  else if (entry->id == 0x10) {
    __end3_1 = std::
               vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
               ::begin(&entry->children);
    child_1 = (BlockOrRecord *)
              std::
              vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
              ::end(&entry->children);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
                               *)&child_1), bVar1) {
      pBVar2 = __gnu_cxx::
               __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
               ::operator*(&__end3_1);
      bVar1 = parse_metadata_attachment_record(this,pBVar2);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
      ::operator++(&__end3_1);
    }
  }
  return true;
}

Assistant:

bool ModuleParseContext::parse_function_child_block(const BlockOrRecord &entry)
{
	switch (KnownBlocks(entry.id))
	{
	case KnownBlocks::CONSTANTS_BLOCK:
	{
		for (auto &child : entry.children)
			if (!parse_constants_record(child))
				return false;
		break;
	}

	case KnownBlocks::METADATA_ATTACHMENT:
	{
		for (auto &child : entry.children)
			if (!parse_metadata_attachment_record(child))
				return false;
		break;
	}

	default:
		break;
	}

	return true;
}